

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall
cmMakefile::IncludeScope::IncludeScope
          (IncludeScope *this,cmMakefile *mf,string *filenametoread,bool noPolicyScope)

{
  cmMakefile *pcVar1;
  PolicyStatus PVar2;
  cmListFileBacktrace local_48;
  
  this->Makefile = mf;
  this->NoPolicyScope = noPolicyScope;
  this->CheckCMP0011 = false;
  this->ReportError = true;
  cmListFileBacktrace::Push(&local_48,&mf->Backtrace,filenametoread);
  cmListFileBacktrace::operator=(&this->Makefile->Backtrace,&local_48);
  cmListFileBacktrace::~cmListFileBacktrace(&local_48);
  PushFunctionBlockerBarrier(this->Makefile);
  cmState::CreateIncludeFileSnapshot
            (&local_48.Bottom,this->Makefile->GlobalGenerator->CMakeInstance->State,
             &this->Makefile->StateSnapshot,filenametoread);
  pcVar1 = this->Makefile;
  (pcVar1->StateSnapshot).Position.Position = local_48.Bottom.Position.Position;
  (pcVar1->StateSnapshot).State = local_48.Bottom.State;
  (pcVar1->StateSnapshot).Position.Tree = local_48.Bottom.Position.Tree;
  if (this->NoPolicyScope == false) {
    PVar2 = cmStateSnapshot::GetPolicy(&this->Makefile->StateSnapshot,CMP0011);
    switch(PVar2) {
    case OLD:
      this->NoPolicyScope = true;
      break;
    case WARN:
      local_48.Bottom.Position.Position = 0;
      local_48.Cur = (Entry *)0x0;
      local_48.Bottom.State = (cmState *)0x0;
      local_48.Bottom.Position.Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x0;
      cmStateSnapshot::PushPolicy(&this->Makefile->StateSnapshot,(PolicyMap *)&local_48,true);
      this->CheckCMP0011 = true;
      break;
    case REQUIRED_IF_USED:
    case REQUIRED_ALWAYS:
      this->CheckCMP0011 = true;
    case NEW:
      local_48.Bottom.Position.Position = 0;
      local_48.Cur = (Entry *)0x0;
      local_48.Bottom.State = (cmState *)0x0;
      local_48.Bottom.Position.Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x0;
      cmStateSnapshot::PushPolicy(&this->Makefile->StateSnapshot,(PolicyMap *)&local_48,false);
    }
  }
  return;
}

Assistant:

cmMakefile::IncludeScope::IncludeScope(cmMakefile* mf,
                                       std::string const& filenametoread,
                                       bool noPolicyScope)
  : Makefile(mf)
  , NoPolicyScope(noPolicyScope)
  , CheckCMP0011(false)
  , ReportError(true)
{
  this->Makefile->Backtrace = this->Makefile->Backtrace.Push(filenametoread);

  this->Makefile->PushFunctionBlockerBarrier();

  this->Makefile->StateSnapshot =
    this->Makefile->GetState()->CreateIncludeFileSnapshot(
      this->Makefile->StateSnapshot, filenametoread);
  if (!this->NoPolicyScope) {
    // Check CMP0011 to determine the policy scope type.
    switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0011)) {
      case cmPolicies::WARN:
        // We need to push a scope to detect whether the script sets
        // any policies that would affect the includer and therefore
        // requires a warning.  We use a weak scope to simulate OLD
        // behavior by allowing policy changes to affect the includer.
        this->Makefile->PushPolicy(true);
        this->CheckCMP0011 = true;
        break;
      case cmPolicies::OLD:
        // OLD behavior is to not push a scope at all.
        this->NoPolicyScope = true;
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        // We should never make this policy required, but we handle it
        // here just in case.
        this->CheckCMP0011 = true;
        CM_FALLTHROUGH;
      case cmPolicies::NEW:
        // NEW behavior is to push a (strong) scope.
        this->Makefile->PushPolicy();
        break;
    }
  }
}